

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall
lunasvg::Canvas::strokePath(Canvas *this,Path *path,StrokeData *strokeData,Transform *transform)

{
  float *dashes;
  
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_transform(this->m_canvas,&transform->m_matrix);
  plutovg_canvas_set_line_width(this->m_canvas,strokeData->m_lineWidth);
  plutovg_canvas_set_miter_limit(this->m_canvas,strokeData->m_miterLimit);
  plutovg_canvas_set_line_cap(this->m_canvas,(uint)strokeData->m_lineCap);
  plutovg_canvas_set_line_join(this->m_canvas,(uint)strokeData->m_lineJoin);
  plutovg_canvas_set_dash_offset(this->m_canvas,strokeData->m_dashOffset);
  dashes = (strokeData->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  plutovg_canvas_set_dash_array
            (this->m_canvas,dashes,
             (int)((ulong)((long)(strokeData->m_dashArray).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)dashes) >> 2));
  plutovg_canvas_set_operator(this->m_canvas,PLUTOVG_OPERATOR_SRC_OVER);
  plutovg_canvas_stroke_path(this->m_canvas,path->m_data);
  return;
}

Assistant:

void Canvas::strokePath(const Path& path, const StrokeData& strokeData, const Transform& transform)
{
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_transform(m_canvas, &transform.matrix());
    plutovg_canvas_set_line_width(m_canvas, strokeData.lineWidth());
    plutovg_canvas_set_miter_limit(m_canvas, strokeData.miterLimit());
    plutovg_canvas_set_line_cap(m_canvas, static_cast<plutovg_line_cap_t>(strokeData.lineCap()));
    plutovg_canvas_set_line_join(m_canvas, static_cast<plutovg_line_join_t>(strokeData.lineJoin()));
    plutovg_canvas_set_dash_offset(m_canvas, strokeData.dashOffset());
    plutovg_canvas_set_dash_array(m_canvas, strokeData.dashArray().data(), strokeData.dashArray().size());
    plutovg_canvas_set_operator(m_canvas, PLUTOVG_OPERATOR_SRC_OVER);
    plutovg_canvas_stroke_path(m_canvas, path.data());
}